

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lzop.c
# Opt level: O0

int archive_write_lzop_free(archive_write_filter *f)

{
  void *__ptr;
  long in_RDI;
  write_lzop *data;
  
  __ptr = *(void **)(in_RDI + 0x40);
  __archive_write_program_free((archive_write_program_data *)0x170a85);
  free(__ptr);
  return 0;
}

Assistant:

static int
archive_write_lzop_free(struct archive_write_filter *f)
{
	struct write_lzop *data = (struct write_lzop *)f->data;

#if defined(HAVE_LZO_LZOCONF_H) && defined(HAVE_LZO_LZO1X_H)
	free(data->uncompressed);
	free(data->compressed);
	free(data->work_buffer);
#else
	__archive_write_program_free(data->pdata);
#endif
	free(data);
	return (ARCHIVE_OK);
}